

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yang_print_parsed_linkage(lys_ypr_ctx *pctx,lysp_module *modp)

{
  uint local_8c;
  uint local_7c;
  uint local_6c;
  ulong local_60;
  uint local_4c;
  uint local_3c;
  ulong local_30;
  ulong local_20;
  uint64_t u;
  lysp_module *modp_local;
  lys_ypr_ctx *pctx_local;
  
  local_20 = 0;
  while( true ) {
    if (modp->imports == (lysp_import *)0x0) {
      local_30 = 0;
    }
    else {
      local_30 = *(ulong *)(modp->imports[-1].rev + 6);
    }
    if (local_30 <= local_20) break;
    if ((modp->imports[local_20].flags & 0x1000) == 0) {
      if ((((pctx->field_0).field_0.flags & 1) != 0) &&
         ((pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags & 0xfffe,
         ((pctx->field_0).field_0.options & 2) == 0)) {
        ly_print_((pctx->field_0).field_0.out,"\n");
      }
      if (((pctx->field_0).field_0.options & 2) == 0) {
        local_3c = (uint)(pctx->field_0).field_0.level << 1;
      }
      else {
        local_3c = 0;
      }
      ly_print_((pctx->field_0).field_0.out,"%*simport %s {\n",(ulong)local_3c,"",
                modp->imports[local_20].name);
      (pctx->field_0).field_0.level = (pctx->field_0).field_0.level + 1;
      yprp_extension_instances(pctx,LY_STMT_IMPORT,'\0',modp->imports[local_20].exts,(ly_bool *)0x0)
      ;
      ypr_substmt(pctx,LY_STMT_PREFIX,'\0',modp->imports[local_20].prefix,'\0',
                  modp->imports[local_20].exts);
      if (modp->imports[local_20].rev[0] != '\0') {
        ypr_substmt(pctx,LY_STMT_REVISION_DATE,'\0',modp->imports[local_20].rev,'\0',
                    modp->imports[local_20].exts);
      }
      ypr_substmt(pctx,LY_STMT_DESCRIPTION,'\0',modp->imports[local_20].dsc,'\0',
                  modp->imports[local_20].exts);
      ypr_substmt(pctx,LY_STMT_REFERENCE,'\0',modp->imports[local_20].ref,'\0',
                  modp->imports[local_20].exts);
      (pctx->field_0).field_0.level = (pctx->field_0).field_0.level - 1;
      if (((pctx->field_0).field_0.options & 2) == 0) {
        local_4c = (uint)(pctx->field_0).field_0.level << 1;
      }
      else {
        local_4c = 0;
      }
      ly_print_((pctx->field_0).field_0.out,"%*s}\n",(ulong)local_4c,"");
    }
    local_20 = local_20 + 1;
  }
  if (modp->imports != (lysp_import *)0x0) {
    (pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags | 1;
  }
  local_20 = 0;
  while( true ) {
    if (modp->includes == (lysp_include *)0x0) {
      local_60 = 0;
    }
    else {
      local_60 = *(ulong *)(modp->includes[-1].rev + 8);
    }
    if (local_60 <= local_20) break;
    if (modp->includes[local_20].injected == '\0') {
      if ((((pctx->field_0).field_0.flags & 1) != 0) &&
         ((pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags & 0xfffe,
         ((pctx->field_0).field_0.options & 2) == 0)) {
        ly_print_((pctx->field_0).field_0.out,"\n");
      }
      if ((((modp->includes[local_20].rev[0] == '\0') &&
           (modp->includes[local_20].dsc == (char *)0x0)) &&
          (modp->includes[local_20].ref == (char *)0x0)) &&
         (modp->includes[local_20].exts == (lysp_ext_instance *)0x0)) {
        if (((pctx->field_0).field_0.options & 2) == 0) {
          local_8c = (uint)(pctx->field_0).field_0.level << 1;
        }
        else {
          local_8c = 0;
        }
        ly_print_((pctx->field_0).field_0.out,"\n%*sinclude \"%s\";\n",(ulong)local_8c,"",
                  modp->includes[local_20].name);
      }
      else {
        if (((pctx->field_0).field_0.options & 2) == 0) {
          local_6c = (uint)(pctx->field_0).field_0.level << 1;
        }
        else {
          local_6c = 0;
        }
        ly_print_((pctx->field_0).field_0.out,"%*sinclude %s {\n",(ulong)local_6c,"",
                  modp->includes[local_20].name);
        (pctx->field_0).field_0.level = (pctx->field_0).field_0.level + 1;
        yprp_extension_instances
                  (pctx,LY_STMT_INCLUDE,'\0',modp->includes[local_20].exts,(ly_bool *)0x0);
        if (modp->includes[local_20].rev[0] != '\0') {
          ypr_substmt(pctx,LY_STMT_REVISION_DATE,'\0',modp->includes[local_20].rev,'\0',
                      modp->includes[local_20].exts);
        }
        ypr_substmt(pctx,LY_STMT_DESCRIPTION,'\0',modp->includes[local_20].dsc,'\0',
                    modp->includes[local_20].exts);
        ypr_substmt(pctx,LY_STMT_REFERENCE,'\0',modp->includes[local_20].ref,'\0',
                    modp->includes[local_20].exts);
        (pctx->field_0).field_0.level = (pctx->field_0).field_0.level - 1;
        if (((pctx->field_0).field_0.options & 2) == 0) {
          local_7c = (uint)(pctx->field_0).field_0.level << 1;
        }
        else {
          local_7c = 0;
        }
        ly_print_((pctx->field_0).field_0.out,"%*s}\n",(ulong)local_7c,"");
      }
    }
    local_20 = local_20 + 1;
  }
  if (modp->includes != (lysp_include *)0x0) {
    (pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags | 1;
  }
  return;
}

Assistant:

static void
yang_print_parsed_linkage(struct lys_ypr_ctx *pctx, const struct lysp_module *modp)
{
    LY_ARRAY_COUNT_TYPE u;

    LY_ARRAY_FOR(modp->imports, u) {
        if (modp->imports[u].flags & LYS_INTERNAL) {
            continue;
        }

        YPR_EXTRA_LINE_PRINT(pctx);
        ly_print_(pctx->out, "%*simport %s {\n", INDENT, modp->imports[u].name);
        LEVEL++;
        yprp_extension_instances(pctx, LY_STMT_IMPORT, 0, modp->imports[u].exts, NULL);
        ypr_substmt(pctx, LY_STMT_PREFIX, 0, modp->imports[u].prefix, 0, modp->imports[u].exts);
        if (modp->imports[u].rev[0]) {
            ypr_substmt(pctx, LY_STMT_REVISION_DATE, 0, modp->imports[u].rev, 0, modp->imports[u].exts);
        }
        ypr_substmt(pctx, LY_STMT_DESCRIPTION, 0, modp->imports[u].dsc, 0, modp->imports[u].exts);
        ypr_substmt(pctx, LY_STMT_REFERENCE, 0, modp->imports[u].ref, 0, modp->imports[u].exts);
        LEVEL--;
        ly_print_(pctx->out, "%*s}\n", INDENT);
    }
    YPR_EXTRA_LINE(modp->imports, pctx);

    LY_ARRAY_FOR(modp->includes, u) {
        if (modp->includes[u].injected) {
            /* do not print the includes injected from submodules */
            continue;
        }
        YPR_EXTRA_LINE_PRINT(pctx);
        if (modp->includes[u].rev[0] || modp->includes[u].dsc || modp->includes[u].ref || modp->includes[u].exts) {
            ly_print_(pctx->out, "%*sinclude %s {\n", INDENT, modp->includes[u].name);
            LEVEL++;
            yprp_extension_instances(pctx, LY_STMT_INCLUDE, 0, modp->includes[u].exts, NULL);
            if (modp->includes[u].rev[0]) {
                ypr_substmt(pctx, LY_STMT_REVISION_DATE, 0, modp->includes[u].rev, 0, modp->includes[u].exts);
            }
            ypr_substmt(pctx, LY_STMT_DESCRIPTION, 0, modp->includes[u].dsc, 0, modp->includes[u].exts);
            ypr_substmt(pctx, LY_STMT_REFERENCE, 0, modp->includes[u].ref, 0, modp->includes[u].exts);
            LEVEL--;
            ly_print_(pctx->out, "%*s}\n", INDENT);
        } else {
            ly_print_(pctx->out, "\n%*sinclude \"%s\";\n", INDENT, modp->includes[u].name);
        }
    }
    YPR_EXTRA_LINE(modp->includes, pctx);
}